

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O1

bool __thiscall
ViconCGStreamIO::VBuffer::Read<float>
          (VBuffer *this,vector<float,_std::allocator<float>_> *o_rValues)

{
  uint *puVar1;
  ulong uVar2;
  uint uVar3;
  pointer pfVar4;
  pointer puVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  pointer __dest;
  ulong __new_size;
  
  pfVar4 = (o_rValues->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((o_rValues->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
      ._M_finish != pfVar4) {
    (o_rValues->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pfVar4;
  }
  uVar3 = (this->m_BufferImpl).m_Offset;
  puVar5 = (this->m_BufferImpl).m_Buffer.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->m_BufferImpl).m_Buffer.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar5) < (ulong)uVar3 + 4) {
    bVar8 = false;
  }
  else {
    __new_size = (ulong)*(uint *)(puVar5 + uVar3);
    (this->m_BufferImpl).m_Offset = uVar3 + 4;
    std::vector<float,_std::allocator<float>_>::resize(o_rValues,__new_size);
    uVar6 = (ulong)(this->m_BufferImpl).m_Offset;
    uVar2 = uVar6 + __new_size * 4;
    puVar5 = (this->m_BufferImpl).m_Buffer.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = (long)(this->m_BufferImpl).m_Buffer.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar5;
    bVar8 = uVar2 <= uVar7;
    if (uVar2 <= uVar7) {
      pfVar4 = (o_rValues->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      __dest = (pointer)0x0;
      if (pfVar4 != (o_rValues->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_finish) {
        __dest = pfVar4;
      }
      memcpy(__dest,puVar5 + uVar6,__new_size << 2);
      puVar1 = &(this->m_BufferImpl).m_Offset;
      *puVar1 = *puVar1 + (int)(__new_size << 2);
    }
  }
  return bVar8;
}

Assistant:

bool Read( std::vector< T > & o_rValues ) const
  {
    o_rValues.clear();
    ViconCGStreamType::UInt32 Size = 0;
    if( !m_BufferImpl.ReadPod( Size ) )
    {
      return false;
    }
    o_rValues.resize( Size );
    return VBufferDetail< VIsPod< T >::Answer >::Read( m_BufferImpl, o_rValues.empty() ? 0 : &o_rValues[ 0 ], Size );
  }